

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

int recovery_test_nonce_function
              (uchar *nonce32,uchar *msg32,uchar *key32,uchar *algo16,void *data,uint counter)

{
  uint64_t uVar1;
  void *in_RDI;
  int in_R9D;
  undefined4 local_4;
  
  if (in_R9D == 0) {
    memset(in_RDI,0,0x20);
    local_4 = 1;
  }
  else if (in_R9D == 1) {
    memset(in_RDI,0xff,0x20);
    local_4 = 1;
  }
  else {
    memset(in_RDI,1,0x20);
    uVar1 = testrand_bits(in_R9D);
    local_4 = (int)uVar1;
  }
  return local_4;
}

Assistant:

static int recovery_test_nonce_function(unsigned char *nonce32, const unsigned char *msg32, const unsigned char *key32, const unsigned char *algo16, void *data, unsigned int counter) {
    (void) msg32;
    (void) key32;
    (void) algo16;
    (void) data;

    /* On the first run, return 0 to force a second run */
    if (counter == 0) {
        memset(nonce32, 0, 32);
        return 1;
    }
    /* On the second run, return an overflow to force a third run */
    if (counter == 1) {
        memset(nonce32, 0xff, 32);
        return 1;
    }
    /* On the next run, return a valid nonce, but flip a coin as to whether or not to fail signing. */
    memset(nonce32, 1, 32);
    return testrand_bits(1);
}